

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int planxythetamlevlat(PlannerType plannerType,char *envCfgFilename,char *motPrimFilename,
                      bool forwardSearch)

{
  void *pvVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  anaPlanner *this;
  ostream *poVar5;
  FILE *__stream;
  runtime_error *prVar6;
  ulong uVar7;
  ulong uVar8;
  char *__s;
  bool bVar9;
  vector<sbpl_xy_theta_pt_t,_std::allocator<sbpl_xy_theta_pt_t>_> xythetaPath;
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsV;
  uchar cost_possibly_circumscribed_thresh_addlevels [2];
  uchar cost_inscribed_thresh_addlevels [2];
  vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> perimeterptsVV [2];
  MDPConfig MDPCfg;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  EnvironmentNAVXYTHETAMLEVLAT environment_navxythetalat;
  sbpl_2Dpt_t local_458;
  long *local_448;
  void *pvStack_440;
  long local_438 [2];
  void *local_428;
  iterator iStack_420;
  sbpl_2Dpt_t *local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  iterator iStack_400;
  sbpl_2Dpt_t *local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined4 local_3d0;
  undefined4 local_3cc;
  void *local_3c8;
  undefined8 uStack_3c0;
  long local_3b8 [47];
  _IO_FILE local_240 [2];
  
  local_428 = (void *)0x0;
  iStack_420._M_current = (sbpl_2Dpt_t *)0x0;
  local_418 = (sbpl_2Dpt_t *)0x0;
  local_458.x = -0.02;
  local_458.y = -0.02;
  std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
            ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_428,(iterator)0x0,&local_458)
  ;
  local_458.x = 0.02;
  local_458.y = -0.02;
  if (iStack_420._M_current == local_418) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_428,iStack_420,&local_458);
  }
  else {
    (iStack_420._M_current)->x = 0.02;
    (iStack_420._M_current)->y = -0.02;
    iStack_420._M_current = iStack_420._M_current + 1;
  }
  local_458.x = 0.02;
  local_458.y = 0.02;
  if (iStack_420._M_current == local_418) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_428,iStack_420,&local_458);
  }
  else {
    (iStack_420._M_current)->x = 0.02;
    (iStack_420._M_current)->y = 0.02;
    iStack_420._M_current = iStack_420._M_current + 1;
  }
  local_458.x = -0.02;
  local_458.y = 0.02;
  if (iStack_420._M_current == local_418) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_428,iStack_420,&local_458);
  }
  else {
    (iStack_420._M_current)->x = -0.02;
    (iStack_420._M_current)->y = 0.02;
    iStack_420._M_current = iStack_420._M_current + 1;
  }
  EnvironmentNAVXYTHETAMLEVLAT::EnvironmentNAVXYTHETAMLEVLAT
            ((EnvironmentNAVXYTHETAMLEVLAT *)local_240);
  cVar2 = EnvironmentNAVXYTHETALATTICE::InitializeEnv
                    ((char *)local_240,(vector *)envCfgFilename,(char *)&local_428);
  if (cVar2 == '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"ERROR: InitializeEnv failed");
    *(undefined ***)prVar6 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3e8 = 0;
  uStack_3e0 = 0;
  local_3f8 = (sbpl_2Dpt_t *)0x0;
  uStack_3f0 = 0;
  local_408 = 0;
  iStack_400._M_current = (sbpl_2Dpt_t *)0x0;
  local_458.x = -0.02;
  local_458.y = -0.02;
  std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
            ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_408,(iterator)0x0,&local_458)
  ;
  local_458.x = 0.02;
  local_458.y = -0.02;
  if (iStack_400._M_current == local_3f8) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_408,iStack_400,&local_458);
  }
  else {
    (iStack_400._M_current)->x = 0.02;
    (iStack_400._M_current)->y = -0.02;
    iStack_400._M_current = iStack_400._M_current + 1;
  }
  local_458.x = 0.02;
  local_458.y = 0.02;
  if (iStack_400._M_current == local_3f8) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_408,iStack_400,&local_458);
  }
  else {
    (iStack_400._M_current)->x = 0.02;
    (iStack_400._M_current)->y = 0.02;
    iStack_400._M_current = iStack_400._M_current + 1;
  }
  local_458.x = -0.02;
  local_458.y = 0.02;
  if (iStack_400._M_current == local_3f8) {
    std::vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>>::_M_realloc_insert<sbpl_2Dpt_t_const&>
              ((vector<sbpl_2Dpt_t,std::allocator<sbpl_2Dpt_t>> *)&local_408,iStack_400,&local_458);
  }
  else {
    *(undefined4 *)&(iStack_400._M_current)->x = 0x47ae147b;
    *(undefined4 *)((long)&(iStack_400._M_current)->x + 4) = 0xbf947ae1;
    *(undefined4 *)&(iStack_400._M_current)->y = 0x47ae147b;
    *(undefined4 *)((long)&(iStack_400._M_current)->y + 4) = 0x3f947ae1;
    iStack_400._M_current = iStack_400._M_current + 1;
  }
  printf("Number of additional levels = %d\n",1);
  uStack_410._6_2_ = 0xffff;
  uStack_410._4_2_ = 0;
  cVar2 = EnvironmentNAVXYTHETAMLEVLAT::InitializeAdditionalLevels
                    ((int)local_240,(vector *)0x1,(uchar *)&local_408,
                     (uchar *)((long)&uStack_410 + 6));
  if (cVar2 == '\0') {
    local_448 = local_438;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_448,"ERROR: InitializeAdditionalLevels failed with numofaddlevels=",
               "");
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&local_3c8,(string *)&local_448,_S_out|_S_in);
    if (local_448 != local_438) {
      operator_delete(local_448,local_438[0] + 1);
    }
    std::ostream::operator<<((ostream *)local_3b8,1);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_448);
    *(undefined ***)prVar6 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar4 = EnvironmentNAVXYTHETALATTICE::GetEnvNavConfig();
  cVar2 = EnvironmentNAVXYTHETAMLEVLAT::Set2DMapforAddLev
                    ((uchar **)local_240,(int)*(undefined8 *)(lVar4 + 0x28));
  if (cVar2 == '\0') {
    local_448 = local_438;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_448,"ERROR: Setting Map for the Additional Level failed with level "
               ,"");
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&local_3c8,(string *)&local_448,_S_out|_S_in);
    if (local_448 != local_438) {
      operator_delete(local_448,local_438[0] + 1);
    }
    std::ostream::operator<<((ostream *)local_3b8,0);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar6,(string *)&local_448);
    *(undefined ***)prVar6 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar2 = EnvironmentNAVXYTHETALATTICE::InitializeMDPCfg((MDPConfig *)local_240);
  if (cVar2 == '\0') {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"ERROR: InitializeMDPCfg failed");
    *(undefined ***)prVar6 = &PTR__runtime_error_0010ec48;
    __cxa_throw(prVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  local_3c8 = (void *)0x0;
  uStack_3c0 = 0;
  local_3b8[0] = 0;
  switch(plannerType) {
  case PLANNER_TYPE_ADSTAR:
    puts("Initializing ADPlanner...");
    this = (anaPlanner *)operator_new(0x98);
    ADPlanner::ADPlanner((ADPlanner *)this,(DiscreteSpaceInformation *)local_240,forwardSearch);
    break;
  case PLANNER_TYPE_ARASTAR:
    puts("Initializing ARAPlanner...");
    this = (anaPlanner *)operator_new(0xa0);
    ARAPlanner::ARAPlanner((ARAPlanner *)this,(DiscreteSpaceInformation *)local_240,forwardSearch);
    break;
  default:
    puts("Invalid planner type");
    this = (anaPlanner *)0x0;
    break;
  case PLANNER_TYPE_RSTAR:
    puts("Invalid configuration: xytheta environment does not support rstar planner...");
    iVar3 = 0;
    goto LAB_00107140;
  case PLANNER_TYPE_ANASTAR:
    puts("Initializing anaPlanner...");
    this = (anaPlanner *)operator_new(0x48);
    anaPlanner::anaPlanner(this,(DiscreteSpaceInformation *)local_240,forwardSearch);
  }
  iVar3 = (**(code **)(*(long *)this + 0x28))(this,local_3d0);
  if (iVar3 == 0) {
    puts("ERROR: failed to set start state");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"ERROR: failed to set start state");
  }
  else {
    iVar3 = (**(code **)(*(long *)this + 0x20))(this,local_3cc);
    if (iVar3 != 0) {
      (**(code **)(*(long *)this + 0x90))(0,this);
      (**(code **)(*(long *)this + 0x40))(this,0);
      puts("start planning...");
      iVar3 = (*(code *)**(undefined8 **)this)(0,this,&local_3c8);
      puts("done planning");
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"size of solution=",0x11);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      EnvironmentNAVXYTHETALATTICE::PrintTimeStat(local_240);
      __stream = fopen("sol.txt","w");
      if (__stream == (FILE *)0x0) {
        puts("ERROR: could not open solution file");
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"ERROR: could not open solution file");
        *(undefined ***)prVar6 = &PTR__runtime_error_0010ec48;
        __cxa_throw(prVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
      }
      local_448 = (long *)0x0;
      pvStack_440 = (void *)0x0;
      local_438[0] = 0;
      EnvironmentNAVXYTHETALAT::ConvertStateIDPathintoXYThetaPath
                ((vector *)local_240,(vector *)&local_3c8);
      printf("solution size=%d\n",
             (ulong)(uint)((int)((ulong)((long)pvStack_440 - (long)local_448) >> 3) * -0x55555555));
      if ((long *)pvStack_440 != local_448) {
        uVar7 = 0;
        uVar8 = 1;
        do {
          fprintf(__stream,"%.3f %.3f %.3f\n",(int)*(undefined8 *)((long)local_448 + uVar7 * 0x18),
                  *(undefined8 *)((long)local_448 + uVar7 * 0x18 + 8),
                  *(undefined8 *)((long)local_448 + uVar7 * 0x18 + 0x10));
          uVar7 = ((long)pvStack_440 - (long)local_448 >> 3) * -0x5555555555555555;
          bVar9 = uVar8 <= uVar7;
          lVar4 = uVar7 - uVar8;
          uVar7 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar9 && lVar4 != 0);
      }
      fclose(__stream);
      EnvironmentNAVXYTHETALATTICE::PrintTimeStat(local_240);
      __s = "Solution is found";
      if (iVar3 == 0) {
        __s = "Solution does not exist";
      }
      puts(__s);
      fflush((FILE *)0x0);
      (**(code **)(*(long *)this + 0xa0))(this);
      if (local_448 != (long *)0x0) {
        operator_delete(local_448,local_438[0] - (long)local_448);
      }
LAB_00107140:
      if (local_3c8 != (void *)0x0) {
        operator_delete(local_3c8,local_3b8[0] - (long)local_3c8);
      }
      lVar4 = 0x30;
      do {
        pvVar1 = *(void **)((long)&iStack_420._M_current + lVar4);
        if (pvVar1 != (void *)0x0) {
          operator_delete(pvVar1,*(long *)((long)&uStack_410 + lVar4) - (long)pvVar1);
        }
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
      EnvironmentNAVXYTHETAMLEVLAT::~EnvironmentNAVXYTHETAMLEVLAT
                ((EnvironmentNAVXYTHETAMLEVLAT *)local_240);
      if (local_428 != (void *)0x0) {
        operator_delete(local_428,(long)local_418 - (long)local_428);
      }
      return iVar3;
    }
    puts("ERROR: failed to set goal state");
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"ERROR: failed to set goal state");
  }
  *(undefined ***)prVar6 = &PTR__runtime_error_0010ec48;
  __cxa_throw(prVar6,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int planxythetamlevlat(PlannerType plannerType, char* envCfgFilename, char* motPrimFilename, bool forwardSearch)
{
    int bRet = 0;

    double allocated_time_secs = 10.0; //in seconds
    double initialEpsilon = 3.0;
    MDPConfig MDPCfg;
    bool bsearchuntilfirstsolution = false;
    bool bforwardsearch = forwardSearch;

    //set the perimeter of the robot (it is given with 0,0,0 robot ref. point for which planning is done)
    //this is for the default level - base level
    vector<sbpl_2Dpt_t> perimeterptsV;
    sbpl_2Dpt_t pt_m;
    double halfwidth = 0.02; //0.3;
    double halflength = 0.02; //0.45;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsV.push_back(pt_m);

    //Initialize Environment (should be called before initializing anything else)
    EnvironmentNAVXYTHETAMLEVLAT environment_navxythetalat;

    if (!environment_navxythetalat.InitializeEnv(envCfgFilename, perimeterptsV, motPrimFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    //this is for the second level - upper body level
    vector<sbpl_2Dpt_t> perimeterptsVV[2];
    perimeterptsVV[0].clear();
    halfwidth = 0.02;
    halflength = 0.02;
    pt_m.x = -halflength;
    pt_m.y = -halfwidth;
    perimeterptsVV[0].push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = -halfwidth;
    perimeterptsVV[0].push_back(pt_m);
    pt_m.x = halflength;
    pt_m.y = halfwidth;
    perimeterptsVV[0].push_back(pt_m);
    pt_m.x = -halflength;
    pt_m.y = halfwidth;
    perimeterptsVV[0].push_back(pt_m);

    //	perimeterptsV.clear();
    //	perimeterptsVV[0].clear();

    //enable the second level
    int numofaddlevels = 1;
    printf("Number of additional levels = %d\n", numofaddlevels);
    unsigned char cost_inscribed_thresh_addlevels[2]; //size should be at least numofaddlevels
    unsigned char cost_possibly_circumscribed_thresh_addlevels[2]; //size should be at least numofaddlevels
    //no costs are indicative of whether a cell is within inner circle
    cost_inscribed_thresh_addlevels[0] = 255;
    //no costs are indicative of whether a cell is within outer circle
    cost_possibly_circumscribed_thresh_addlevels[0] = 0;
    //no costs are indicative of whether a cell is within inner circle
    cost_inscribed_thresh_addlevels[1] = 255;
    //no costs are indicative of whether a cell is within outer circle
    cost_possibly_circumscribed_thresh_addlevels[1] = 0;
    if (!environment_navxythetalat.InitializeAdditionalLevels(numofaddlevels, perimeterptsVV,
                                                              cost_inscribed_thresh_addlevels,
                                                              cost_possibly_circumscribed_thresh_addlevels))
    {
        std::stringstream ss("ERROR: InitializeAdditionalLevels failed with numofaddlevels=");
        ss << numofaddlevels;
        throw SBPL_Exception(ss.str());
    }

    //set the map for the second level (index parameter for the additional levels and is zero based)
    //for this example, we pass in the same map as the map for the base. In general, it can be a totally different map
    //as it corresponds to a different level
    //NOTE: this map has to have costs set correctly with respect to inner and outer radii of the robot
    //if the second level of the robot has these radii different than at the base level, then costs
    //should reflect this
    //(see explanation for cost_possibly_circumscribed_thresh and
    //cost_inscribed_thresh parameters in environment_navxythetalat.h file)
    int addlevind = 0;
    if (!environment_navxythetalat.Set2DMapforAddLev(
            (const unsigned char**)(environment_navxythetalat.GetEnvNavConfig()->Grid2D), addlevind))
    {
        std::stringstream ss("ERROR: Setting Map for the Additional Level failed with level ");
        ss << addlevind;
        throw SBPL_Exception(ss.str());
    }

    // Initialize MDP Info
    if (!environment_navxythetalat.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    // plan a path
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Invalid configuration: xytheta environment does not support rstar planner...\n");
        return 0;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_navxythetalat, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    if (planner->set_start(MDPCfg.startstateid) == 0) {
        printf("ERROR: failed to set start state\n");
        throw SBPL_Exception("ERROR: failed to set start state");
    }

    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        printf("ERROR: failed to set goal state\n");
        throw SBPL_Exception("ERROR: failed to set goal state");
    }
    planner->set_initialsolution_eps(initialEpsilon);

    //set search mode
    planner->set_search_mode(bsearchuntilfirstsolution);

    printf("start planning...\n");
    bRet = planner->replan(allocated_time_secs, &solution_stateIDs_V);
    printf("done planning\n");
    std::cout << "size of solution=" << solution_stateIDs_V.size() << std::endl;

    environment_navxythetalat.PrintTimeStat(stdout);

    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        printf("ERROR: could not open solution file\n");
        throw SBPL_Exception("ERROR: could not open solution file");
    }
    vector<sbpl_xy_theta_pt_t> xythetaPath;
    environment_navxythetalat.ConvertStateIDPathintoXYThetaPath(&solution_stateIDs_V, &xythetaPath);
    printf("solution size=%d\n", (unsigned int)xythetaPath.size());
    for (unsigned int i = 0; i < xythetaPath.size(); i++) {
        fprintf(fSol, "%.3f %.3f %.3f\n", xythetaPath.at(i).x, xythetaPath.at(i).y, xythetaPath.at(i).theta);
    }
    fclose(fSol);

    environment_navxythetalat.PrintTimeStat(stdout);

    //print a path
    if (bRet) {
        //print the solution
        printf("Solution is found\n");
    }
    else {
        printf("Solution does not exist\n");
    }

    fflush(NULL);

    delete planner;

    return bRet;
}